

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop~.c
# Opt level: O0

void * loop_new(void)

{
  t_object *owner;
  t_symbol *ptVar1;
  t_loop *x;
  
  owner = (t_object *)pd_new(loop_class);
  loopctl_init((t_loopctl *)&owner[1].te_g.g_next);
  inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  return owner;
}

Assistant:

static void *loop_new(void)
{
    t_loop *x = (t_loop *)pd_new(loop_class);
    loopctl_init(&x->x_loopctl);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    outlet_new(&x->x_obj, gensym("signal"));
    outlet_new(&x->x_obj, gensym("signal"));
    return (x);
}